

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

bool __thiscall QWidgetPrivate::handleClose(QWidgetPrivate *this,CloseMode mode)

{
  undefined1 *puVar1;
  uint uVar2;
  QWidget *p;
  QDebug *pQVar3;
  long lVar4;
  bool bVar5;
  long in_FS_OFFSET;
  QDebug local_78;
  undefined8 uStack_70;
  QWeakPointer<QObject> local_68;
  undefined4 uStack_58;
  undefined4 local_54;
  char *local_50;
  Stream *local_48;
  undefined1 local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p = *(QWidget **)&this->field_0x8;
  QtPrivateLogging::lcWidgetShowHide();
  if (((byte)QtPrivateLogging::lcWidgetShowHide::category.field_2.bools.enabledDebug._q_value.
             _M_base._M_i & 1) != 0) {
    local_68.d._0_4_ = 2;
    local_68.d._4_4_ = 0;
    local_68.value._0_4_ = 0;
    local_68.value._4_4_ = 0;
    uStack_58 = 0;
    local_54 = 0;
    local_50 = QtPrivateLogging::lcWidgetShowHide::category.name;
    QMessageLogger::debug();
    pQVar3 = QDebug::operator<<(&local_78,"Handling close event for");
    local_48 = pQVar3->stream;
    *(int *)(local_48 + 0x28) = *(int *)(local_48 + 0x28) + 1;
    ::operator<<((Stream *)local_40,(QWidget *)&local_48);
    QDebug::~QDebug((QDebug *)local_40);
    QDebug::~QDebug((QDebug *)&local_48);
    QDebug::~QDebug(&local_78);
  }
  uVar2 = *(uint *)&(this->data).field_0x10;
  bVar5 = true;
  if ((uVar2 >> 9 & 1) != 0) goto LAB_002fefa6;
  *(uint *)&(this->data).field_0x10 = uVar2 | 0x200;
  local_68.d._0_4_ = 0xaaaaaaaa;
  local_68.d._4_4_ = 0xaaaaaaaa;
  local_68.value._0_4_ = 0xaaaaaaaa;
  local_68.value._4_4_ = 0xaaaaaaaa;
  QPointer<QWidget>::QPointer<void>((QPointer<QWidget> *)&local_68,p);
  if ((mode == CloseNoEvent) || ((*(uint *)&(this->data).field_0x10 & 0x40000) != 0)) {
LAB_002fef14:
    lVar4 = CONCAT44(local_68.d._4_4_,local_68.d._0_4_);
    bVar5 = true;
    if (lVar4 != 0) {
      if (((*(int *)(lVar4 + 4) != 0) && (CONCAT44(local_68.value._4_4_,local_68.value._0_4_) != 0))
         && ((p->data->widget_attributes & 0x10000) == 0)) {
        (**(code **)(*(long *)p + 0x68))(p,0);
        lVar4 = CONCAT44(local_68.d._4_4_,local_68.d._0_4_);
        if (lVar4 == 0) goto LAB_002fef9c;
      }
      if (((*(int *)(lVar4 + 4) != 0) && (CONCAT44(local_68.value._4_4_,local_68.value._0_4_) != 0))
         && (puVar1 = &(this->data).field_0x11, *puVar1 = *puVar1 & 0xfd,
            (*(byte *)(*(long *)&p->field_0x8 + 0x242) & 0x80) != 0)) {
        QWidget::setAttribute(p,WA_DeleteOnClose,false);
        QObject::deleteLater();
      }
    }
  }
  else {
    local_78.stream = (Stream *)&DAT_aaaaaaaaaaaaaaaa;
    uStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    QCloseEvent::QCloseEvent((QCloseEvent *)&local_78);
    if (mode == CloseWithSpontaneousEvent) {
      QCoreApplication::sendSpontaneousEvent(&p->super_QObject,(QEvent *)&local_78);
    }
    else {
      QCoreApplication::sendEvent(&p->super_QObject,(QEvent *)&local_78);
    }
    if ((((CONCAT44(local_68.d._4_4_,local_68.d._0_4_) == 0) ||
         (*(int *)(CONCAT44(local_68.d._4_4_,local_68.d._0_4_) + 4) == 0)) ||
        (CONCAT44(local_68.value._4_4_,local_68.value._0_4_) == 0)) || (uStack_70._4_1_ != '\0')) {
      QCloseEvent::~QCloseEvent((QCloseEvent *)&local_78);
      goto LAB_002fef14;
    }
    puVar1 = &(this->data).field_0x11;
    *puVar1 = *puVar1 & 0xfd;
    QCloseEvent::~QCloseEvent((QCloseEvent *)&local_78);
    bVar5 = false;
  }
LAB_002fef9c:
  QWeakPointer<QObject>::~QWeakPointer(&local_68);
LAB_002fefa6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetPrivate::handleClose(CloseMode mode)
{
    Q_Q(QWidget);
    qCDebug(lcWidgetShowHide) << "Handling close event for" << q;

    if (data.is_closing)
        return true;

    // We might not have initiated the close, so update the state now that we know
    data.is_closing = true;

    QPointer<QWidget> that = q;

    if (data.in_destructor)
        mode = CloseNoEvent;

    if (mode != CloseNoEvent) {
        QCloseEvent e;
        if (mode == CloseWithSpontaneousEvent)
            QApplication::sendSpontaneousEvent(q, &e);
        else
            QCoreApplication::sendEvent(q, &e);
        if (!that.isNull() && !e.isAccepted()) {
            data.is_closing = false;
            return false;
        }
    }

    // even for windows, make sure we deliver a hide event and that all children get hidden
    if (!that.isNull() && !q->isHidden())
        q->hide();

    if (!that.isNull()) {
        data.is_closing = false;
        if (q->testAttribute(Qt::WA_DeleteOnClose)) {
            q->setAttribute(Qt::WA_DeleteOnClose, false);
            q->deleteLater();
        }
    }
    return true;
}